

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O1

void cfg_reset_items(config_item *items)

{
  cfg_data_type cVar1;
  char *pcVar2;
  char **ppcVar3;
  uint uVar4;
  config_item *pcVar5;
  uint uVar6;
  config_item *pcVar7;
  
  if (items != (config_item *)0x0) {
    pcVar2 = items->key;
    while (pcVar2 != (char *)0x0) {
      cVar1 = items->type;
      if (items->list == true) {
        if (cVar1 - cdt_bool < 4) {
LAB_00105d97:
          if (items->_malloc != (void *)0x0) {
            free(items->_malloc);
            items->value = (void *)0x0;
            items->_malloc = (void *)0x0;
          }
        }
        else if (cVar1 == cdt_object) {
          if (((items->vcount != 0) && (pcVar5 = items->subitems, pcVar5 != (config_item_t *)0x0))
             && (items->subitems_free_cb != (_func_void_config_item_t_ptr_uint *)0x0)) {
            uVar4 = items->vcount;
            if (uVar4 != 0) {
              uVar6 = 0;
              do {
                cfg_reset_items(pcVar5);
                pcVar7 = pcVar5;
                if (pcVar5 == (config_item *)0x0) {
                  pcVar5 = (config_item *)0x0;
                }
                else {
                  do {
                    pcVar5 = pcVar7 + 1;
                    ppcVar3 = &pcVar7->key;
                    pcVar7 = pcVar5;
                  } while (*ppcVar3 != (char *)0x0);
                }
                uVar6 = uVar6 + 1;
                uVar4 = items->vcount;
              } while (uVar6 < uVar4);
            }
            (*items->subitems_free_cb)(items->subitems,uVar4);
            items->subitems = (config_item_t *)0x0;
          }
          items->value = (void *)0x0;
        }
        else if (cVar1 == cdt_string) {
          if (items->value != (void *)0x0) {
            uVar4 = items->vcount;
            while (uVar4 != 0) {
              free(*(void **)((long)items->value + (ulong)(uVar4 - 1) * 8));
              uVar4 = items->vcount - 1;
              items->vcount = uVar4;
            }
          }
          goto LAB_00105d97;
        }
      }
      else if (cVar1 == cdt_object) {
        cfg_reset_items(items->subitems);
      }
      else if ((cVar1 == cdt_string) && (items->_malloc != (void *)0x0)) {
        free(items->_malloc);
        items->_malloc = (void *)0x0;
        *(undefined8 *)items->value = 0;
      }
      items->vcount = 0;
      pcVar5 = items + 1;
      items = items + 1;
      pcVar2 = pcVar5->key;
    }
  }
  return;
}

Assistant:

void cfg_reset_items(config_item *items)
{
    unsigned int n;
    config_item * next_items;
    if (!items)
        return;

    for (; items->key != NULL; items = cfg_next_item(items)){
        if (items->list) {
            switch (items->type) {
            case cdt_string:
                if (items->value) {
                    // Free memory for each string
                    for (; items->vcount > 0; items->vcount--)
                        free(((char **)items->value)[items->vcount -1]);
                }
                // Fall through
            case cdt_bool:
            case cdt_uint16:
            case cdt_int:
            case cdt_double:
                // Free memory for whole array
                if (items->_malloc) {
                    free(items->_malloc);
                    items->_malloc = items->value = NULL;
                }
                break;
            case cdt_object:
                // Recursively reset items in object array.
                if (items->vcount && items->subitems && items->subitems_free_cb) {
                    next_items = items->subitems;
                    for (n = 0; n < items->vcount; n++) {
                        cfg_reset_items(next_items);
                        next_items = next_items_group(next_items);
                    }
                    items->subitems_free_cb(items->subitems, items->vcount);
                    items->subitems = NULL;
                }
                items->value = NULL;
                break;
            default:
                // Should not be here
                break;
            }
        }
        else {
            switch (items->type) {
            case cdt_string:
                // Free memory allocated for string
                if (items->_malloc) {
                    free(items->_malloc);
                    items->_malloc = NULL;
                    *(char **)items->value = NULL;
                }
                break;
            case cdt_object:
                // Recursively reset subitems of object
                cfg_reset_items(items->subitems);
                break;
            default:
                 // No need to free memory
                break;
            }
        }
        items->vcount = 0;
    }
}